

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rd.c
# Opt level: O0

void av1_fill_coeff_costs(CoeffCosts *coeff_costs,FRAME_CONTEXT *fc,int num_planes)

{
  int in_EDX;
  long in_RSI;
  long in_RDI;
  int i_1;
  int ctx_8;
  int j;
  int i;
  int prev_cost;
  int br_rate [4];
  int ctx_7;
  int ctx_6;
  int ctx_5;
  int ctx_4;
  int ctx_3;
  int ctx_2;
  int ctx_1;
  LV_MAP_COEFF_COST *pcost_1;
  int plane_1;
  int tx_size;
  aom_cdf_prob *pcdf;
  int ctx;
  LV_MAP_EOB_COST *pcost;
  int plane;
  int eob_multi_size;
  int nplanes;
  undefined4 in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  aom_cdf_prob *in_stack_ffffffffffffff58;
  int *in_stack_ffffffffffffff60;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  aom_cdf_prob local_78 [10];
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  long local_48;
  int local_40;
  int local_3c;
  long local_38;
  int local_2c;
  long local_28;
  int local_20;
  int local_1c;
  int local_18;
  long local_10;
  long local_8;
  
  local_90 = in_EDX;
  if (1 < in_EDX) {
    local_90 = 2;
  }
  local_18 = local_90;
  local_1c = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    if (6 < local_1c) {
      for (local_3c = 0; local_3c < 5; local_3c = local_3c + 1) {
        for (local_40 = 0; local_40 < local_18; local_40 = local_40 + 1) {
          local_48 = local_8 + (long)local_3c * 0x1d80 + (long)local_40 * 0xec0;
          for (local_4c = 0; local_4c < 0xd; local_4c = local_4c + 1) {
            av1_cost_tokens_from_cdf
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          }
          for (local_50 = 0; local_50 < 4; local_50 = local_50 + 1) {
            av1_cost_tokens_from_cdf
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          }
          for (local_54 = 0; local_54 < 0x2a; local_54 = local_54 + 1) {
            av1_cost_tokens_from_cdf
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          }
          for (local_58 = 0; local_58 < 0x2a; local_58 = local_58 + 1) {
            *(undefined4 *)(local_48 + (long)local_58 * 0x20 + 0xa8) = 0;
            *(int *)(local_48 + (long)local_58 * 0x20 + 0xac) =
                 (*(int *)(local_48 + (long)local_58 * 0x20 + 0x9c) + 0x200) -
                 *(int *)(local_48 + 0x98 + (long)local_58 * 0x20);
            *(int *)(local_48 + (long)local_58 * 0x20 + 0xb0) =
                 *(int *)(local_48 + (long)local_58 * 0x20 + 0xa0) -
                 *(int *)(local_48 + (long)local_58 * 0x20 + 0x9c);
            *(int *)(local_48 + (long)local_58 * 0x20 + 0xb4) =
                 *(int *)(local_48 + (long)local_58 * 0x20 + 0xa4) -
                 *(int *)(local_48 + (long)local_58 * 0x20 + 0xa0);
          }
          for (local_5c = 0; local_5c < 9; local_5c = local_5c + 1) {
            av1_cost_tokens_from_cdf
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          }
          for (local_60 = 0; local_60 < 3; local_60 = local_60 + 1) {
            av1_cost_tokens_from_cdf
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
          }
          for (local_64 = 0; local_64 < 0x15; local_64 = local_64 + 1) {
            local_7c = 0;
            in_stack_ffffffffffffff58 = local_78;
            in_stack_ffffffffffffff60 = (int *)(local_10 + 0x1766);
            in_stack_ffffffffffffff54 = local_3c;
            if (2 < local_3c) {
              in_stack_ffffffffffffff54 = 3;
            }
            av1_cost_tokens_from_cdf
                      (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                       (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
            for (local_80 = 0; local_80 < 0xc; local_80 = local_80 + 3) {
              for (local_84 = 0; local_84 < 3; local_84 = local_84 + 1) {
                *(int *)(local_48 + 0x638 + (long)local_64 * 0x68 + (long)(local_80 + local_84) * 4)
                     = local_7c + *(int *)(local_78 + (long)local_84 * 2);
              }
              local_7c = *(int *)(local_78 + (long)local_84 * 2) + local_7c;
            }
            *(int *)(local_48 + 0x638 + (long)local_64 * 0x68 + (long)local_80 * 4) = local_7c;
          }
          for (local_88 = 0; local_88 < 0x15; local_88 = local_88 + 1) {
            *(undefined4 *)(local_48 + (long)local_88 * 0x68 + 0x66c) =
                 *(undefined4 *)(local_48 + 0x638 + (long)local_88 * 0x68);
            for (local_8c = 1; local_8c < 0xd; local_8c = local_8c + 1) {
              *(int *)(local_48 + 0x638 + (long)local_88 * 0x68 + (long)(local_8c + 0xd) * 4) =
                   *(int *)(local_48 + 0x638 + (long)local_88 * 0x68 + (long)local_8c * 4) -
                   *(int *)(local_48 + 0x638 + (long)local_88 * 0x68 + (long)(local_8c + -1) * 4);
            }
          }
        }
      }
      return;
    }
    for (local_20 = 0; local_20 < local_18; local_20 = local_20 + 1) {
      local_28 = local_8 + 0x9380 + (long)local_1c * 0xb0 + (long)local_20 * 0x58;
      for (local_2c = 0; local_2c < 2; local_2c = local_2c + 1) {
        switch(local_1c) {
        case 0:
          local_38 = local_10 + 0x3c6 + (long)local_20 * 0x18 + (long)local_2c * 0xc;
          break;
        case 1:
          local_38 = local_10 + 0x3f6 + (long)local_20 * 0x1c + (long)local_2c * 0xe;
          break;
        case 2:
          local_38 = local_10 + 0x42e + (long)local_20 * 0x20 + (long)local_2c * 0x10;
          break;
        case 3:
          local_38 = local_10 + 0x46e + (long)local_20 * 0x24 + (long)local_2c * 0x12;
          break;
        case 4:
          local_38 = local_10 + 0x4b6 + (long)local_20 * 0x28 + (long)local_2c * 0x14;
          break;
        case 5:
          local_38 = local_10 + 0x506 + (long)local_20 * 0x2c + (long)local_2c * 0x16;
          break;
        case 6:
        default:
          local_38 = local_10 + 0x55e + (long)local_20 * 0x30 + (long)local_2c * 0x18;
        }
        av1_cost_tokens_from_cdf
                  (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                   (int *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

void av1_fill_coeff_costs(CoeffCosts *coeff_costs, FRAME_CONTEXT *fc,
                          const int num_planes) {
  const int nplanes = AOMMIN(num_planes, PLANE_TYPES);
  for (int eob_multi_size = 0; eob_multi_size < 7; ++eob_multi_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_EOB_COST *pcost = &coeff_costs->eob_costs[eob_multi_size][plane];

      for (int ctx = 0; ctx < 2; ++ctx) {
        aom_cdf_prob *pcdf;
        switch (eob_multi_size) {
          case 0: pcdf = fc->eob_flag_cdf16[plane][ctx]; break;
          case 1: pcdf = fc->eob_flag_cdf32[plane][ctx]; break;
          case 2: pcdf = fc->eob_flag_cdf64[plane][ctx]; break;
          case 3: pcdf = fc->eob_flag_cdf128[plane][ctx]; break;
          case 4: pcdf = fc->eob_flag_cdf256[plane][ctx]; break;
          case 5: pcdf = fc->eob_flag_cdf512[plane][ctx]; break;
          case 6:
          default: pcdf = fc->eob_flag_cdf1024[plane][ctx]; break;
        }
        av1_cost_tokens_from_cdf(pcost->eob_cost[ctx], pcdf, NULL);
      }
    }
  }
  for (int tx_size = 0; tx_size < TX_SIZES; ++tx_size) {
    for (int plane = 0; plane < nplanes; ++plane) {
      LV_MAP_COEFF_COST *pcost = &coeff_costs->coeff_costs[tx_size][plane];

      for (int ctx = 0; ctx < TXB_SKIP_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->txb_skip_cost[ctx],
                                 fc->txb_skip_cdf[tx_size][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS_EOB; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_eob_cost[ctx],
                                 fc->coeff_base_eob_cdf[tx_size][plane][ctx],
                                 NULL);
      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->base_cost[ctx],
                                 fc->coeff_base_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < SIG_COEF_CONTEXTS; ++ctx) {
        pcost->base_cost[ctx][4] = 0;
        pcost->base_cost[ctx][5] = pcost->base_cost[ctx][1] +
                                   av1_cost_literal(1) -
                                   pcost->base_cost[ctx][0];
        pcost->base_cost[ctx][6] =
            pcost->base_cost[ctx][2] - pcost->base_cost[ctx][1];
        pcost->base_cost[ctx][7] =
            pcost->base_cost[ctx][3] - pcost->base_cost[ctx][2];
      }

      for (int ctx = 0; ctx < EOB_COEF_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->eob_extra_cost[ctx],
                                 fc->eob_extra_cdf[tx_size][plane][ctx], NULL);

      for (int ctx = 0; ctx < DC_SIGN_CONTEXTS; ++ctx)
        av1_cost_tokens_from_cdf(pcost->dc_sign_cost[ctx],
                                 fc->dc_sign_cdf[plane][ctx], NULL);

      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        int br_rate[BR_CDF_SIZE];
        int prev_cost = 0;
        int i, j;
        av1_cost_tokens_from_cdf(
            br_rate, fc->coeff_br_cdf[AOMMIN(tx_size, TX_32X32)][plane][ctx],
            NULL);
        for (i = 0; i < COEFF_BASE_RANGE; i += BR_CDF_SIZE - 1) {
          for (j = 0; j < BR_CDF_SIZE - 1; j++) {
            pcost->lps_cost[ctx][i + j] = prev_cost + br_rate[j];
          }
          prev_cost += br_rate[j];
        }
        pcost->lps_cost[ctx][i] = prev_cost;
      }
      for (int ctx = 0; ctx < LEVEL_CONTEXTS; ++ctx) {
        pcost->lps_cost[ctx][0 + COEFF_BASE_RANGE + 1] =
            pcost->lps_cost[ctx][0];
        for (int i = 1; i <= COEFF_BASE_RANGE; ++i) {
          pcost->lps_cost[ctx][i + COEFF_BASE_RANGE + 1] =
              pcost->lps_cost[ctx][i] - pcost->lps_cost[ctx][i - 1];
        }
      }
    }
  }
}